

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationweights.cpp
# Opt level: O2

UBool __thiscall
icu_63::CollationWeights::getWeightRanges
          (CollationWeights *this,uint32_t lowerLimit,uint32_t upperLimit)

{
  WeightRange *pWVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  int32_t iVar5;
  int32_t iVar6;
  uint32_t uVar7;
  int32_t *piVar8;
  byte bVar9;
  byte bVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  uint uVar19;
  WeightRange lower [5];
  WeightRange upper [5];
  
  iVar5 = lengthOfWeight(lowerLimit);
  iVar6 = lengthOfWeight(upperLimit);
  if ((lowerLimit < upperLimit) &&
     ((iVar6 <= iVar5 ||
      (bVar9 = (char)iVar5 * -8, (upperLimit >> (bVar9 & 0x1f)) << (bVar9 & 0x1f) != lowerLimit))))
  {
    lower[0].start = 0;
    lower[0].end = 0;
    lower[0].length = 0;
    lower[0].count = 0;
    lower[1].start = 0;
    lower[1].end = 0;
    lower[1].length = 0;
    lower[1].count = 0;
    lower[2].start = 0;
    lower[2].end = 0;
    lower[2].length = 0;
    lower[2].count = 0;
    lower[3].start = 0;
    lower[3].end = 0;
    lower[3].length = 0;
    lower[3].count = 0;
    lower[4].start = 0;
    lower[4].end = 0;
    lower[4].length = 0;
    lower[4].count = 0;
    upper[0].start = 0;
    upper[0].end = 0;
    upper[0].length = 0;
    upper[0].count = 0;
    upper[1].start = 0;
    upper[1].end = 0;
    upper[1].length = 0;
    upper[1].count = 0;
    upper[2].start = 0;
    upper[2].end = 0;
    upper[2].length = 0;
    upper[2].count = 0;
    upper[3].start = 0;
    upper[3].end = 0;
    upper[3].length = 0;
    upper[3].count = 0;
    upper[4].start = 0;
    upper[4].end = 0;
    upper[4].length = 0;
    upper[4].count = 0;
    iVar12 = this->middleLength;
    lVar15 = (long)iVar5;
    lVar18 = (long)iVar12;
    iVar11 = iVar5 * -8 + 0x20;
    lVar17 = 0;
    for (lVar16 = lVar15; lVar18 < lVar16; lVar16 = lVar16 + -1) {
      bVar9 = (byte)iVar11;
      uVar19 = lowerLimit >> (bVar9 & 0x1f) & 0xff;
      uVar13 = *(uint *)((long)this->maxBytes + lVar17 + lVar15 * 4);
      iVar14 = uVar13 - uVar19;
      if (uVar19 <= uVar13 && iVar14 != 0) {
        (&lower[lVar15].start)[lVar17] = (int)(1L << (bVar9 & 0x3f)) + lowerLimit;
        (&lower[lVar15].end)[lVar17] =
             uVar13 << (bVar9 & 0x1f) | -0x100 << (bVar9 & 0x1f) & lowerLimit;
        (&lower[lVar15].length)[lVar17] = (int32_t)lVar16;
        (&lower[lVar15].count)[lVar17] = iVar14;
      }
      iVar11 = iVar11 + 8;
      lowerLimit = (lowerLimit >> ((byte)iVar11 & 0x1f)) << ((byte)iVar11 & 0x1f);
      lVar17 = lVar17 + -4;
    }
    bVar9 = (char)iVar12 * -8 + 0x20;
    lVar15 = (long)iVar6;
    iVar11 = iVar6 * -8 + 0x20;
    lVar17 = 0;
    for (lVar16 = lVar15; lVar18 < lVar16; lVar16 = lVar16 + -1) {
      bVar10 = (byte)iVar11;
      uVar19 = upperLimit >> (bVar10 & 0x1f) & 0xff;
      uVar13 = *(uint *)((long)this->minBytes + lVar17 + lVar15 * 4);
      iVar14 = uVar19 - uVar13;
      if (uVar13 <= uVar19 && iVar14 != 0) {
        (&upper[lVar15].start)[lVar17] =
             uVar13 << (bVar10 & 0x1f) | -0x100 << (bVar10 & 0x1f) & upperLimit;
        (&upper[lVar15].end)[lVar17] = (int)(-1L << (bVar10 & 0x3f)) + upperLimit;
        (&upper[lVar15].length)[lVar17] = (int32_t)lVar16;
        (&upper[lVar15].count)[lVar17] = iVar14;
      }
      iVar11 = iVar11 + 8;
      upperLimit = (upperLimit >> ((byte)iVar11 & 0x1f)) << ((byte)iVar11 & 0x1f);
      lVar17 = lVar17 + -4;
    }
    uVar13 = 0xffffffff;
    if (lowerLimit < 0xff000000) {
      uVar13 = (int)(1L << (bVar9 & 0x3f)) + lowerLimit;
    }
    uVar19 = upperLimit + (int)(-1L << (bVar9 & 0x3f));
    if (uVar19 < uVar13) {
      lVar16 = 4;
      lVar15 = 0x3c;
      bVar9 = 0;
      while( true ) {
        if (lVar16 <= lVar18) goto LAB_00237a0c;
        iVar12 = *(int *)((long)&lower[1].start + lVar15);
        if ((0 < iVar12) && (iVar11 = *(int *)((long)&upper[1].start + lVar15), 0 < iVar11)) break;
LAB_00237967:
        lVar16 = lVar16 + -1;
        lVar15 = lVar15 + -0x10;
        bVar9 = bVar9 + 8;
      }
      uVar13 = *(uint *)((long)&lower[0].length + lVar15);
      uVar19 = *(uint *)((long)&upper[0].end + lVar15);
      if (uVar13 < uVar19 || uVar13 == uVar19) {
        if (uVar13 != uVar19) {
          uVar7 = incWeight(this,uVar13,(int32_t)lVar16);
          if (uVar7 == uVar19) {
            *(undefined4 *)((long)&lower[0].length + lVar15) =
                 *(undefined4 *)((long)&upper[0].length + lVar15);
            iVar11 = iVar11 + iVar12;
            goto LAB_002379e7;
          }
        }
        goto LAB_00237967;
      }
      uVar13 = *(uint *)((long)&upper[0].length + lVar15);
      *(uint *)((long)&lower[0].length + lVar15) = uVar13;
      iVar11 = ((uVar13 >> (bVar9 & 0x1f) & 0xff) -
               (*(uint *)((long)&lower[0].end + lVar15) >> (bVar9 & 0x1f) & 0xff)) + 1;
LAB_002379e7:
      *(int *)((long)&lower[1].start + lVar15) = iVar11;
      *(undefined4 *)((long)&upper[1].start + lVar15) = 0;
      while (lVar16 = lVar16 + -1, lVar18 < lVar16) {
        *(undefined4 *)((long)&upper[0].start + lVar15) = 0;
        *(undefined4 *)((long)&lower[0].start + lVar15) = 0;
        lVar15 = lVar15 + -0x10;
      }
LAB_00237a0c:
      this->rangeCount = 0;
      goto LAB_00237a1a;
    }
    this->rangeCount = 0;
    if ((int)(uVar19 - uVar13 >> (bVar9 & 0x1f)) < 0) {
LAB_00237a1a:
      iVar12 = 0;
    }
    else {
      this->ranges[0].start = uVar13;
      this->ranges[0].end = uVar19;
      this->ranges[0].length = iVar12;
      this->ranges[0].count = (uVar19 - uVar13 >> (bVar9 & 0x1f)) + 1;
      this->rangeCount = 1;
      iVar12 = 1;
    }
    piVar8 = &this->rangeCount;
    lVar16 = lVar18 << 4;
    while( true ) {
      if (3 < lVar18) break;
      if (0 < *(int *)((long)&upper[1].count + lVar16)) {
        uVar2 = *(undefined8 *)((long)&upper[1].start + lVar16);
        uVar3 = *(undefined8 *)((long)&upper[1].length + lVar16);
        pWVar1 = this->ranges + iVar12;
        pWVar1->start = (int)uVar2;
        pWVar1->end = (int)((ulong)uVar2 >> 0x20);
        pWVar1->length = (int)uVar3;
        pWVar1->count = (int)((ulong)uVar3 >> 0x20);
        iVar12 = *piVar8 + 1;
        *piVar8 = iVar12;
      }
      if (0 < *(int *)((long)&lower[1].count + lVar16)) {
        uVar2 = *(undefined8 *)((long)&lower[1].start + lVar16);
        uVar3 = *(undefined8 *)((long)&lower[1].length + lVar16);
        pWVar1 = this->ranges + iVar12;
        pWVar1->start = (int)uVar2;
        pWVar1->end = (int)((ulong)uVar2 >> 0x20);
        pWVar1->length = (int)uVar3;
        pWVar1->count = (int)((ulong)uVar3 >> 0x20);
        iVar12 = *piVar8 + 1;
        *piVar8 = iVar12;
      }
      lVar18 = lVar18 + 1;
      lVar16 = lVar16 + 0x10;
    }
    bVar4 = 0 < iVar12;
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

UBool
CollationWeights::getWeightRanges(uint32_t lowerLimit, uint32_t upperLimit) {
    U_ASSERT(lowerLimit != 0);
    U_ASSERT(upperLimit != 0);

    /* get the lengths of the limits */
    int32_t lowerLength=lengthOfWeight(lowerLimit);
    int32_t upperLength=lengthOfWeight(upperLimit);

#ifdef UCOL_DEBUG
    printf("length of lower limit 0x%08lx is %ld\n", lowerLimit, lowerLength);
    printf("length of upper limit 0x%08lx is %ld\n", upperLimit, upperLength);
#endif
    U_ASSERT(lowerLength>=middleLength);
    // Permit upperLength<middleLength: The upper limit for secondaries is 0x10000.

    if(lowerLimit>=upperLimit) {
#ifdef UCOL_DEBUG
        printf("error: no space between lower & upper limits\n");
#endif
        return FALSE;
    }

    /* check that neither is a prefix of the other */
    if(lowerLength<upperLength) {
        if(lowerLimit==truncateWeight(upperLimit, lowerLength)) {
#ifdef UCOL_DEBUG
            printf("error: lower limit 0x%08lx is a prefix of upper limit 0x%08lx\n", lowerLimit, upperLimit);
#endif
            return FALSE;
        }
    }
    /* if the upper limit is a prefix of the lower limit then the earlier test lowerLimit>=upperLimit has caught it */

    WeightRange lower[5], middle, upper[5]; /* [0] and [1] are not used - this simplifies indexing */
    uprv_memset(lower, 0, sizeof(lower));
    uprv_memset(&middle, 0, sizeof(middle));
    uprv_memset(upper, 0, sizeof(upper));

    /*
     * With the limit lengths of 1..4, there are up to 7 ranges for allocation:
     * range     minimum length
     * lower[4]  4
     * lower[3]  3
     * lower[2]  2
     * middle    1
     * upper[2]  2
     * upper[3]  3
     * upper[4]  4
     *
     * We are now going to calculate up to 7 ranges.
     * Some of them will typically overlap, so we will then have to merge and eliminate ranges.
     */
    uint32_t weight=lowerLimit;
    for(int32_t length=lowerLength; length>middleLength; --length) {
        uint32_t trail=getWeightTrail(weight, length);
        if(trail<maxBytes[length]) {
            lower[length].start=incWeightTrail(weight, length);
            lower[length].end=setWeightTrail(weight, length, maxBytes[length]);
            lower[length].length=length;
            lower[length].count=maxBytes[length]-trail;
        }
        weight=truncateWeight(weight, length-1);
    }
    if(weight<0xff000000) {
        middle.start=incWeightTrail(weight, middleLength);
    } else {
        // Prevent overflow for primary lead byte FF
        // which would yield a middle range starting at 0.
        middle.start=0xffffffff;  // no middle range
    }

    weight=upperLimit;
    for(int32_t length=upperLength; length>middleLength; --length) {
        uint32_t trail=getWeightTrail(weight, length);
        if(trail>minBytes[length]) {
            upper[length].start=setWeightTrail(weight, length, minBytes[length]);
            upper[length].end=decWeightTrail(weight, length);
            upper[length].length=length;
            upper[length].count=trail-minBytes[length];
        }
        weight=truncateWeight(weight, length-1);
    }
    middle.end=decWeightTrail(weight, middleLength);

    /* set the middle range */
    middle.length=middleLength;
    if(middle.end>=middle.start) {
        middle.count=(int32_t)((middle.end-middle.start)>>(8*(4-middleLength)))+1;
    } else {
        /* no middle range, eliminate overlaps */
        for(int32_t length=4; length>middleLength; --length) {
            if(lower[length].count>0 && upper[length].count>0) {
                // Note: The lowerEnd and upperStart weights are versions of
                // lowerLimit and upperLimit (which are lowerLimit<upperLimit),
                // truncated (still less-or-equal)
                // and then with their last bytes changed to the
                // maxByte (for lowerEnd) or minByte (for upperStart).
                const uint32_t lowerEnd=lower[length].end;
                const uint32_t upperStart=upper[length].start;
                UBool merged=FALSE;

                if(lowerEnd>upperStart) {
                    // These two lower and upper ranges collide.
                    // Since lowerLimit<upperLimit and lowerEnd and upperStart
                    // are versions with only their last bytes modified
                    // (and following ones removed/reset to 0),
                    // lowerEnd>upperStart is only possible
                    // if the leading bytes are equal
                    // and lastByte(lowerEnd)>lastByte(upperStart).
                    U_ASSERT(truncateWeight(lowerEnd, length-1)==
                            truncateWeight(upperStart, length-1));
                    // Intersect these two ranges.
                    lower[length].end=upper[length].end;
                    lower[length].count=
                            (int32_t)getWeightTrail(lower[length].end, length)-
                            (int32_t)getWeightTrail(lower[length].start, length)+1;
                    // count might be <=0 in which case there is no room,
                    // and the range-collecting code below will ignore this range.
                    merged=TRUE;
                } else if(lowerEnd==upperStart) {
                    // Not possible, unless minByte==maxByte which is not allowed.
                    U_ASSERT(minBytes[length]<maxBytes[length]);
                } else /* lowerEnd<upperStart */ {
                    if(incWeight(lowerEnd, length)==upperStart) {
                        // Merge adjacent ranges.
                        lower[length].end=upper[length].end;
                        lower[length].count+=upper[length].count;  // might be >countBytes
                        merged=TRUE;
                    }
                }
                if(merged) {
                    // Remove all shorter ranges.
                    // There was no room available for them between the ranges we just merged.
                    upper[length].count=0;
                    while(--length>middleLength) {
                        lower[length].count=upper[length].count=0;
                    }
                    break;
                }
            }
        }
    }

#ifdef UCOL_DEBUG
    /* print ranges */
    for(int32_t length=4; length>=2; --length) {
        if(lower[length].count>0) {
            printf("lower[%ld] .start=0x%08lx .end=0x%08lx .count=%ld\n", length, lower[length].start, lower[length].end, lower[length].count);
        }
    }
    if(middle.count>0) {
        printf("middle   .start=0x%08lx .end=0x%08lx .count=%ld\n", middle.start, middle.end, middle.count);
    }
    for(int32_t length=2; length<=4; ++length) {
        if(upper[length].count>0) {
            printf("upper[%ld] .start=0x%08lx .end=0x%08lx .count=%ld\n", length, upper[length].start, upper[length].end, upper[length].count);
        }
    }
#endif

    /* copy the ranges, shortest first, into the result array */
    rangeCount=0;
    if(middle.count>0) {
        uprv_memcpy(ranges, &middle, sizeof(WeightRange));
        rangeCount=1;
    }
    for(int32_t length=middleLength+1; length<=4; ++length) {
        /* copy upper first so that later the middle range is more likely the first one to use */
        if(upper[length].count>0) {
            uprv_memcpy(ranges+rangeCount, upper+length, sizeof(WeightRange));
            ++rangeCount;
        }
        if(lower[length].count>0) {
            uprv_memcpy(ranges+rangeCount, lower+length, sizeof(WeightRange));
            ++rangeCount;
        }
    }
    return rangeCount>0;
}